

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

QString * QMakeInternal::IoUtils::shellQuoteWin(QString *__return_storage_ptr__,QString *arg)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  storage_type *psVar5;
  int i;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QByteArrayView QVar8;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QRegularExpression local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((arg->d).size == 0) {
    psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("\"\"",3);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001e39e2;
    QVar8.m_data = psVar5;
    QVar8.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar8);
  }
  else {
    (__return_storage_ptr__->d).size = -0x5555555555555556;
    (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&arg->d);
    bVar1 = hasSpecialChars(__return_storage_ptr__,&shellQuoteWin::iqm);
    if (bVar1) {
      qVar3 = QtPrivate::lengthHelperPointer<char>("(\\\\*)\"");
      latin1.m_data = "(\\\\*)\"";
      latin1.m_size = qVar3;
      QString::QString((QString *)&local_58,latin1);
      QRegularExpression::QRegularExpression(local_40,&local_58,0);
      qVar3 = QtPrivate::lengthHelperPointer<char>("\\1\\1\\\"");
      latin1_00.m_data = "\\1\\1\\\"";
      latin1_00.m_size = qVar3;
      QString::QString((QString *)&local_70,latin1_00);
      QString::replace((QRegularExpression *)__return_storage_ptr__,(QString *)local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QRegularExpression::~QRegularExpression(local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      qVar3 = QtPrivate::lengthHelperPointer<char>("(\\\\+)$");
      latin1_01.m_data = "(\\\\+)$";
      latin1_01.m_size = qVar3;
      QString::QString((QString *)&local_58,latin1_01);
      QRegularExpression::QRegularExpression(local_40,&local_58,0);
      qVar3 = QtPrivate::lengthHelperPointer<char>("\\1\\1");
      latin1_02.m_data = "\\1\\1";
      latin1_02.m_size = qVar3;
      QString::QString((QString *)&local_70,latin1_02);
      QString::replace((QRegularExpression *)__return_storage_ptr__,(QString *)local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QRegularExpression::~QRegularExpression(local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      bVar1 = true;
      iVar7 = 0;
      while ((long)iVar7 < (__return_storage_ptr__->d).size) {
        pcVar4 = (__return_storage_ptr__->d).ptr;
        if (pcVar4 == (char16_t *)0x0) {
          pcVar4 = (char16_t *)&QString::_empty;
        }
        iVar6 = iVar7;
        if (pcVar4[iVar7] == L'\"') {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else if (!bVar1) {
          bVar2 = isSpecialChar(pcVar4[iVar7],(uchar (*) [16])"");
          if (bVar2) {
            iVar6 = iVar7 + 1;
            QString::insert((longlong)__return_storage_ptr__,(QChar)(char16_t)iVar7);
          }
        }
        iVar7 = iVar6 + 1;
      }
      if (!bVar1) {
        QString::append((QChar)(char16_t)__return_storage_ptr__);
      }
      QString::append((QChar)(char16_t)__return_storage_ptr__);
      QString::prepend(__return_storage_ptr__,(QChar)0x22);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_001e39e2:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString IoUtils::shellQuoteWin(const QString &arg)
{
    // Chars that should be quoted (TM). This includes:
    // - control chars & space
    // - the shell meta chars "&()<>^|
    // - the potential separators ,;=
    static const uchar iqm[] = {
        0xff, 0xff, 0xff, 0xff, 0x45, 0x13, 0x00, 0x78,
        0x00, 0x00, 0x00, 0x40, 0x00, 0x00, 0x00, 0x10
    };
    // Shell meta chars that need escaping.
    static const uchar ism[] = {
        0x00, 0x00, 0x00, 0x00, 0x40, 0x03, 0x00, 0x50,
        0x00, 0x00, 0x00, 0x40, 0x00, 0x00, 0x00, 0x10
    }; // &()<>^|

    if (!arg.size())
        return QString::fromLatin1("\"\"");

    QString ret(arg);
    if (hasSpecialChars(ret, iqm)) {
        // The process-level standard quoting allows escaping quotes with backslashes (note
        // that backslashes don't escape themselves, unless they are followed by a quote).
        // Consequently, quotes are escaped and their preceding backslashes are doubled.
        ret.replace(QRegularExpression(QLatin1String("(\\\\*)\"")), QLatin1String("\\1\\1\\\""));
        // Trailing backslashes must be doubled as well, as they are followed by a quote.
        ret.replace(QRegularExpression(QLatin1String("(\\\\+)$")), QLatin1String("\\1\\1"));
        // However, the shell also interprets the command, and no backslash-escaping exists
        // there - a quote always toggles the quoting state, but is nonetheless passed down
        // to the called process verbatim. In the unquoted state, the circumflex escapes
        // meta chars (including itself and quotes), and is removed from the command.
        bool quoted = true;
        for (int i = 0; i < ret.size(); i++) {
            QChar c = ret.unicode()[i];
            if (c.unicode() == '"')
                quoted = !quoted;
            else if (!quoted && isSpecialChar(c.unicode(), ism))
                ret.insert(i++, QLatin1Char('^'));
        }
        if (!quoted)
            ret.append(QLatin1Char('^'));
        ret.append(QLatin1Char('"'));
        ret.prepend(QLatin1Char('"'));
    }
    return ret;
}